

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleUVFilterCols_C(uint8_t *dst_uv,uint8_t *src_uv,int dst_width,int x,int dx)

{
  uint uVar1;
  int iVar2;
  uint16_t b_1;
  uint16_t a_1;
  int xf_1;
  int xi_1;
  uint16_t b;
  uint16_t a;
  int xf;
  int xi;
  int j;
  uint16_t *dst;
  uint16_t *src;
  int dx_local;
  int x_local;
  int dst_width_local;
  uint8_t *src_uv_local;
  uint8_t *dst_uv_local;
  
  dst = (uint16_t *)dst_uv;
  x_local = x;
  for (j = 0; iVar2 = x_local >> 0x10, j < dst_width + -1; j = j + 2) {
    uVar1 = x_local >> 9 & 0x7f;
    *dst = (ushort)(((int)(((int)(uint)*(ushort *)(src_uv + (long)iVar2 * 2) >> 8) * (uVar1 ^ 0x7f)
                          + ((int)(uint)*(ushort *)(src_uv + (long)(iVar2 + 1) * 2) >> 8) * uVar1)
                    >> 7) << 8) |
           (ushort)((int)((*(ushort *)(src_uv + (long)iVar2 * 2) & 0xff) * (uVar1 ^ 0x7f) +
                         (*(ushort *)(src_uv + (long)(iVar2 + 1) * 2) & 0xff) * uVar1) >> 7);
    iVar2 = dx + x_local;
    uVar1 = iVar2 >> 9 & 0x7f;
    dst[1] = (ushort)(((int)(((int)(uint)*(ushort *)(src_uv + (long)(iVar2 >> 0x10) * 2) >> 8) *
                             (uVar1 ^ 0x7f) +
                            ((int)(uint)*(ushort *)(src_uv + (long)((iVar2 >> 0x10) + 1) * 2) >> 8)
                            * uVar1) >> 7) << 8) |
             (ushort)((int)((*(ushort *)(src_uv + (long)(iVar2 >> 0x10) * 2) & 0xff) *
                            (uVar1 ^ 0x7f) +
                           (*(ushort *)(src_uv + (long)((iVar2 >> 0x10) + 1) * 2) & 0xff) * uVar1)
                     >> 7);
    x_local = dx + iVar2;
    dst = dst + 2;
  }
  if ((dst_width & 1U) != 0) {
    uVar1 = x_local >> 9 & 0x7f;
    *dst = (ushort)(((int)(((int)(uint)*(ushort *)(src_uv + (long)iVar2 * 2) >> 8) * (uVar1 ^ 0x7f)
                          + ((int)(uint)*(ushort *)(src_uv + (long)(iVar2 + 1) * 2) >> 8) * uVar1)
                    >> 7) << 8) |
           (ushort)((int)((*(ushort *)(src_uv + (long)iVar2 * 2) & 0xff) * (uVar1 ^ 0x7f) +
                         (*(ushort *)(src_uv + (long)(iVar2 + 1) * 2) & 0xff) * uVar1) >> 7);
  }
  return;
}

Assistant:

void ScaleUVFilterCols_C(uint8_t* dst_uv,
                         const uint8_t* src_uv,
                         int dst_width,
                         int x,
                         int dx) {
  const uint16_t* src = (const uint16_t*)(src_uv);
  uint16_t* dst = (uint16_t*)(dst_uv);
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    int xi = x >> 16;
    int xf = (x >> 9) & 0x7f;
    uint16_t a = src[xi];
    uint16_t b = src[xi + 1];
    dst[0] = BLENDER(a, b, xf);
    x += dx;
    xi = x >> 16;
    xf = (x >> 9) & 0x7f;
    a = src[xi];
    b = src[xi + 1];
    dst[1] = BLENDER(a, b, xf);
    x += dx;
    dst += 2;
  }
  if (dst_width & 1) {
    int xi = x >> 16;
    int xf = (x >> 9) & 0x7f;
    uint16_t a = src[xi];
    uint16_t b = src[xi + 1];
    dst[0] = BLENDER(a, b, xf);
  }
}